

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void glfw_key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  float fVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  char **ppcVar6;
  bool bVar7;
  double dVar8;
  Rotation local_38;
  
  if (action != 1) {
    return;
  }
  if (key == 0x57) {
    uVar3 = (uint)wireframe;
    wireframe = !wireframe;
    glPolygonMode(0x408,uVar3 + 0x1b01,CONCAT44(in_register_00000014,scancode));
    return;
  }
  if (key == 0x100) {
    glfwSetWindowShouldClose(window,1);
    return;
  }
  if (key - 0x31U < 9) {
    legendre_index = (size_t)(key - 0x31U);
    variable = legendre_params + legendre_index;
    var_name = legendre_param_names[legendre_index];
    poVar2 = std::operator<<((ostream *)&std::cout,var_name);
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*variable);
LAB_001107fc:
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  switch(key) {
  case 0x3d:
switchD_00110832_caseD_14e:
    lVar5 = 0x14;
    if ((mods & 1U) == 0) {
      lVar5 = 2;
    }
    phi_n = phi_n + (ulong)(mods & 1U) * 9 + 1;
    theta_n = theta_n + lVar5;
    goto LAB_001109c3;
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x53:
    break;
  case 0x45:
    rotationFrames = rotationFrames + (int)theta_n;
    break;
  case 0x49:
switchD_00110832_caseD_148:
    dVar8 = (double)glfwGetTime();
    uVar3 = 0x3f800000;
    goto LAB_00110923;
  case 0x4a:
switchD_00110832_caseD_144:
    dVar8 = (double)glfwGetTime();
    local_38.axis.field_0._0_8_ = 0x3f80000000000000;
    goto LAB_00110927;
  case 0x4b:
switchD_00110832_caseD_145:
    if (rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
        super__Vector_impl_data._M_start) {
      rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
      super__Vector_impl_data._M_finish =
           rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    rotationFrames = 0;
    antiRotationFrames = 0;
    break;
  case 0x4c:
switchD_00110832_caseD_146:
    dVar8 = (double)glfwGetTime();
    local_38.axis.field_0._0_8_ = 0xbf80000000000000;
    goto LAB_00110927;
  case 0x4d:
switchD_00110832_caseD_142:
    dVar8 = (double)glfwGetTime();
    uVar3 = 0xbf800000;
LAB_00110923:
    local_38.axis.field_0._0_8_ = ZEXT48(uVar3);
LAB_00110927:
    local_38.startTime = (float)dVar8;
    local_38.axis.field_0.field_0.z = 0.0;
    std::vector<Rotation,_std::allocator<Rotation>_>::emplace_back<Rotation>(&rotations,&local_38);
    break;
  case 0x50:
    ppcVar6 = legendre_param_names;
    for (lVar5 = 0; lVar5 != 0x24; lVar5 = lVar5 + 4) {
      poVar2 = std::operator<<((ostream *)&std::cout,*ppcVar6);
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)((long)legendre_params + lVar5))
      ;
      std::endl<char,std::char_traits<char>>(poVar2);
      ppcVar6 = ppcVar6 + 1;
    }
    break;
  case 0x52:
    rotationFrames = rotationFrames + (int)theta_n;
    antiRotationFrames = antiRotationFrames + (int)theta_n;
    break;
  case 0x54:
    textured = !textured;
    poVar2 = std::operator<<((ostream *)&std::cout,"Textured = ");
    pcVar4 = "false";
    if (textured != false) {
      pcVar4 = "true";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    goto LAB_001107fc;
  default:
    switch(key) {
    case 0x142:
      goto switchD_00110832_caseD_142;
    case 0x143:
    case 0x147:
    case 0x149:
    case 0x14a:
    case 0x14b:
    case 0x14c:
      goto switchD_00110832_caseD_143;
    case 0x144:
      goto switchD_00110832_caseD_144;
    case 0x145:
      goto switchD_00110832_caseD_145;
    case 0x146:
      goto switchD_00110832_caseD_146;
    case 0x148:
      goto switchD_00110832_caseD_148;
    case 0x14e:
      goto switchD_00110832_caseD_14e;
    default:
      if (key != 0x2d) {
        if (key == 0x30) {
          *variable = 0.0;
        }
        else {
          if (key == 0x108) {
            fVar1 = *variable + -0.1;
          }
          else {
            if (key != 0x109) {
              return;
            }
            fVar1 = *variable + 0.1;
          }
          *variable = fVar1;
        }
        poVar2 = std::operator<<((ostream *)&std::cout,var_name);
        poVar2 = std::operator<<(poVar2," = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*variable);
        std::endl<char,std::char_traits<char>>(poVar2);
        goto LAB_00110b02;
      }
    case 0x14d:
      bVar7 = (mods & 1U) == 0;
      lVar5 = -0x14;
      if (bVar7) {
        lVar5 = -2;
      }
      theta_n = lVar5 + theta_n;
      phi_n = ((ulong)-(uint)bVar7 | 0xfffffffffffffff6) + phi_n;
      if (theta_n < 0x20) {
        theta_n = 0x20;
      }
      if (phi_n < 0x10) {
        phi_n = 0x10;
      }
    }
LAB_001109c3:
    regenerateIndices();
    regenerateSpherePositions();
    regenerateSHBuffer();
LAB_00110b02:
    regenerateBuffer();
    return;
  }
switchD_00110832_caseD_143:
  return;
}

Assistant:

static void glfw_key_callback(GLFWwindow* window, int key, int scancode, int action, int mods) {
    if (action != GLFW_PRESS) return;

    if (key == GLFW_KEY_ESCAPE) {
        glfwSetWindowShouldClose(window, true);
    } else if (key == GLFW_KEY_W) {
        wireframe = !wireframe;
        glPolygonMode(GL_FRONT_AND_BACK, wireframe ? GL_LINE : GL_FILL);
    } else if (key >= GLFW_KEY_1 && key <= GLFW_KEY_9) {
        legendre_index = size_t(key - GLFW_KEY_1);
        variable = &legendre_params[legendre_index];
        var_name = legendre_param_names[legendre_index];
        cout << var_name << " = " << *variable << endl;
    } else if (key == GLFW_KEY_0) {
        *variable = 0;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_UP) {
        *variable += 0.1;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_DOWN) {
        *variable -= 0.1;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_P) {
        for (int c = 0; c < 9; c++) {
            cout << legendre_param_names[c] << " = " << legendre_params[c] << endl;
        }
    }

    else if (key == GLFW_KEY_T) {
        textured = !textured;
        cout << "Textured = " << (textured ? "true" : "false") << endl;
    }

    else if (key == GLFW_KEY_KP_ADD || key == GLFW_KEY_EQUAL) {
        if (mods & GLFW_MOD_SHIFT) {
            theta_n += 20;
            phi_n += 10;
        } else {
            theta_n += 2;
            phi_n += 1;
        }
        regenerateIndices();
        regenerateSpherePositions();
        regenerateSHBuffer();
        regenerateBuffer();
    }
    else if (key == GLFW_KEY_KP_SUBTRACT || key == GLFW_KEY_MINUS) {
        if (mods & GLFW_MOD_SHIFT) {
            theta_n -= 20;
            phi_n -= 10;
        } else {
            theta_n -= 2;
            phi_n -= 1;
        }
        if (theta_n < MIN_THETA_N) theta_n = MIN_THETA_N;
        if (phi_n < MIN_PHI_N) phi_n = MIN_PHI_N;
        regenerateIndices();
        regenerateSpherePositions();
        regenerateSHBuffer();
        regenerateBuffer();
    }

    else if (key == GLFW_KEY_KP_8 || key == GLFW_KEY_I) {
        rotations.push_back({float(glfwGetTime()), vec3(1, 0, 0)});
    } else if (key == GLFW_KEY_KP_4 || key == GLFW_KEY_J) {
        rotations.push_back({float(glfwGetTime()), vec3(0, 1, 0)});
    } else if (key == GLFW_KEY_KP_2 || key == GLFW_KEY_M) {
        rotations.push_back({float(glfwGetTime()), vec3(-1, 0, 0)});
    } else if (key == GLFW_KEY_KP_6 || key == GLFW_KEY_L) {
        rotations.push_back({float(glfwGetTime()), vec3(0, -1, 0)});
    } else if (key == GLFW_KEY_KP_5 || key == GLFW_KEY_K) {
        rotations.clear();
        rotationFrames = 0;
        antiRotationFrames = 0;
    }

    else if (key == GLFW_KEY_E) {
        rotationFrames += theta_n;
    } else if (key == GLFW_KEY_R) {
        rotationFrames += theta_n;
        antiRotationFrames += theta_n;
    }
}